

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hxx
# Opt level: O2

size_t andres::graph::
       labelComponents<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::validate(lineage::ProblemGraph_const&,lineage::Solution_const&)::SubgraphWithoutCut,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                 (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *graph,
                 SubgraphWithoutCut *mask,
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 labeling)

{
  unsigned_long uVar1;
  pointer pRVar2;
  pointer pAVar3;
  size_t sVar4;
  reference rVar5;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queue;
  vector<bool,_std::allocator<bool>_> visited;
  size_type local_c0;
  unsigned_long *local_b8;
  Value local_b0;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_a8;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  local_a8._M_impl.super__Deque_impl_data._M_map._0_1_ = 0;
  local_b8 = labeling._M_current;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_58,
             (long)(graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(bool *)&local_a8,
             (allocator_type *)&local_c0);
  std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  queue<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>
            ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &local_a8);
  sVar4 = 0;
  for (local_c0 = 0;
      local_c0 <
      (ulong)((long)(graph->vertices_).
                    super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(graph->vertices_).
                    super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5); local_c0 = local_c0 + 1) {
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&local_58,local_c0);
    if ((*rVar5._M_p & rVar5._M_mask) == 0) {
      local_b8[local_c0] = sVar4;
      std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,&local_c0);
      rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)&local_58,local_c0);
      *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
      while (local_a8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_a8._M_impl.super__Deque_impl_data._M_start._M_cur) {
        uVar1 = *local_a8._M_impl.super__Deque_impl_data._M_start._M_cur;
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front
                  ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8);
        pRVar2 = (graph->vertices_).
                 super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (pAVar3 = *(pointer *)
                       &pRVar2[uVar1].vector_.
                        super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
            ; pAVar3 != *(pointer *)
                         ((long)&pRVar2[uVar1].vector_.
                                 super__Vector_base<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>
                         + 8); pAVar3 = pAVar3 + 1) {
          if ((mask->edgeLabels_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
              ._M_impl.super__Vector_impl_data._M_start[pAVar3->edge_] == '\0') {
            rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)&local_58,pAVar3->vertex_);
            if ((*rVar5._M_p & rVar5._M_mask) == 0) {
              local_b8[pAVar3->vertex_] = sVar4;
              local_b0 = pAVar3->vertex_;
              std::deque<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                        ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_a8,&local_b0
                        );
              rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)&local_58,pAVar3->vertex_);
              *rVar5._M_p = *rVar5._M_p | rVar5._M_mask;
            }
          }
          pRVar2 = (graph->vertices_).
                   super__Vector_base<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      sVar4 = sVar4 + 1;
    }
  }
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_a8);
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
  return sVar4;
}

Assistant:

std::size_t
labelComponents(
    const GRAPH& graph,
    const SUBGRAPH_MASK& mask,
    ITERATOR labeling
) {
    std::size_t label = 0;
    std::vector<bool> visited(graph.numberOfVertices(), false);
    std::queue<std::size_t> queue;
    for(std::size_t v = 0; v < graph.numberOfVertices(); ++v) {
        if(mask.vertex(v)) {
            if(!visited[v]) {
                labeling[v] = label; // label
                queue.push(v);
                visited[v] = true;
                while(!queue.empty()) {
                    std::size_t w = queue.front();
                    queue.pop();
                    for(typename GRAPH::AdjacencyIterator it = graph.adjacenciesFromVertexBegin(w);
                    it != graph.adjacenciesFromVertexEnd(w); ++it) {
                        if(mask.edge(it->edge()) 
                        && mask.vertex(it->vertex()) 
                        && !visited[it->vertex()]) {
                            labeling[it->vertex()] = label; // label
                            queue.push(it->vertex());
                            visited[it->vertex()] = true;
                        }
                    }
                }
                label++;
            }
        }
        else {
            labeling[v] = 0;
        }
    }
    return label;
}